

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

void u_on_sstairs(void)

{
  char cVar1;
  monst *pmVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  cVar1 = (level->sstairs).sx;
  uVar5 = (uint)cVar1;
  if (cVar1 == '\0') {
    iVar3 = 0x1f5;
    while( true ) {
      uVar5 = mt_random();
      uVar5 = uVar5 % 0x4f + 1;
      uVar4 = mt_random();
      uVar4 = uVar4 % 0x15;
      if (((level->locations[uVar5][uVar4].typ & 0xfeU) == 0x18) &&
         ((pmVar2 = level->monsters[uVar5][uVar4], pmVar2 == (monst *)0x0 ||
          ((pmVar2->field_0x61 & 2) != 0)))) break;
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) {
        panic("u_on_sstairs: could not relocate player!");
      }
    }
  }
  else {
    uVar4 = (uint)(level->sstairs).sy;
  }
  u_on_newpos(uVar5,uVar4);
  return;
}

Assistant:

void u_on_sstairs(void)
{

	if (level->sstairs.sx) {
	    u_on_newpos(level->sstairs.sx, level->sstairs.sy);
	} else {
	    /* code stolen from goto_level */
	    int trycnt = 0;
	    xchar x, y;

	    do {
		x = rnd(COLNO-1);
		y = rn2(ROWNO);
		if (!badspot(x, y)) {
		    u_on_newpos(x, y);
		    return;
		}
	    } while (++trycnt <= 500);
	    panic("u_on_sstairs: could not relocate player!");
	}
}